

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::spinlock::unlock(spinlock *this)

{
  int iVar1;
  pthread_spinlock_t *in_RDI;
  uint in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  
  iVar1 = pthread_spin_unlock(in_RDI);
  if (iVar1 != 0) {
    crnlib_fail(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return;
}

Assistant:

void spinlock::unlock() {
#if !defined(__APPLE__)
  if (pthread_spin_unlock(&m_spinlock)) {
    CRNLIB_FAIL("spinlock: pthread_spin_unlock() failed");
  }
#else
  os_unfair_lock_unlock(m_lock);
#endif
}